

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprAnalyzeAggList(NameContext *pNC,ExprList *pList)

{
  int iVar1;
  ExprList_item *pEVar2;
  
  if (pList != (ExprList *)0x0) {
    pEVar2 = pList->a;
    for (iVar1 = 0; iVar1 < pList->nExpr; iVar1 = iVar1 + 1) {
      sqlite3ExprAnalyzeAggregates(pNC,pEVar2->pExpr);
      pEVar2 = pEVar2 + 1;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprAnalyzeAggList(NameContext *pNC, ExprList *pList){
  struct ExprList_item *pItem;
  int i;
  if( pList ){
    for(pItem=pList->a, i=0; i<pList->nExpr; i++, pItem++){
      sqlite3ExprAnalyzeAggregates(pNC, pItem->pExpr);
    }
  }
}